

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

InterfaceHandle __thiscall
helics::CommonCore::registerCloningFilter
          (CommonCore *this,string_view filterName,string_view type_in,string_view type_out)

{
  GlobalFederateId global_federateId;
  BaseType BVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  string_view name;
  ActionMessage reg;
  
  checkNewInterface(this,(LocalFederateId)0xfffffefd,filterName,FILTER);
  global_federateId.gid = (this->filterFedID)._M_i.gid;
  ppVar2 = createBasicHandle(this,global_federateId,(LocalFederateId)0x88ca6c00,FILTER,filterName,
                             type_in,type_out,0x200);
  BVar1 = *(BaseType *)((long)&(ppVar2->first)._M_dataplus._M_p + 4);
  ActionMessage::ActionMessage(&reg,cmd_reg_filter);
  name._M_str = (char *)(ppVar2->first).field_2._M_allocated_capacity;
  name._M_len = *(size_t *)((long)&(ppVar2->first).field_2 + 8);
  reg.source_id.gid = global_federateId.gid;
  reg.source_handle.hid = BVar1;
  ActionMessage::name(&reg,name);
  reg.flags._1_1_ = reg.flags._1_1_ | 2;
  if (type_in._M_len != 0 || type_out._M_len != 0) {
    ActionMessage::setStringData(&reg,type_in,type_out);
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,&reg);
  ActionMessage::~ActionMessage(&reg);
  return (InterfaceHandle)BVar1;
}

Assistant:

InterfaceHandle CommonCore::registerCloningFilter(std::string_view filterName,
                                                  std::string_view type_in,
                                                  std::string_view type_out)
{
    checkNewInterface(gLocalCoreId, filterName, InterfaceType::FILTER);
    auto fid = filterFedID.load();

    const auto& handle = createBasicHandle(fid,
                                           LocalFederateId(),
                                           InterfaceType::FILTER,
                                           filterName,
                                           type_in,
                                           type_out,
                                           make_flags(clone_flag));

    auto hid = handle.getInterfaceHandle();

    ActionMessage reg(CMD_REG_FILTER);
    reg.source_id = fid;
    reg.source_handle = hid;
    reg.name(handle.key);
    setActionFlag(reg, clone_flag);
    if ((!type_in.empty()) || (!type_out.empty())) {
        reg.setStringData(type_in, type_out);
    }
    actionQueue.push(std::move(reg));
    return hid;
}